

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall mario::Connector::connecting(Connector *this,int sockfd)

{
  Channel *pCVar1;
  function<void_()> fStack_58;
  _Bind<void_(mario::Connector::*(mario::Connector_*))()> local_38;
  
  this->_state = kConnecting;
  pCVar1 = (Channel *)operator_new(0xa0);
  Channel::Channel(pCVar1,this->_loop,sockfd);
  std::__uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>::reset
            ((__uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_> *)
             &this->_channel,pCVar1);
  pCVar1 = (this->_channel)._M_t.
           super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
           super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
           super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl;
  local_38._M_f = (offset_in_Connector_to_subr)handleWrite;
  local_38._8_8_ = 0;
  local_38._M_bound_args.super__Tuple_impl<0UL,_mario::Connector_*>.
  super__Head_base<0UL,_mario::Connector_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mario::Connector_*>)(_Tuple_impl<0UL,_mario::Connector_*>)this;
  std::function<void()>::function<std::_Bind<void(mario::Connector::*(mario::Connector*))()>,void>
            ((function<void()> *)&fStack_58,&local_38);
  std::function<void_()>::operator=(&pCVar1->_writeCallback,&fStack_58);
  std::_Function_base::~_Function_base(&fStack_58.super__Function_base);
  pCVar1 = (this->_channel)._M_t.
           super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
           super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
           super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl;
  local_38._M_f = (offset_in_Connector_to_subr)handleError;
  local_38._8_8_ = 0;
  local_38._M_bound_args.super__Tuple_impl<0UL,_mario::Connector_*>.
  super__Head_base<0UL,_mario::Connector_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mario::Connector_*>)(_Tuple_impl<0UL,_mario::Connector_*>)this;
  std::function<void()>::function<std::_Bind<void(mario::Connector::*(mario::Connector*))()>,void>
            ((function<void()> *)&fStack_58,&local_38);
  std::function<void_()>::operator=(&pCVar1->_errorCallback,&fStack_58);
  std::_Function_base::~_Function_base(&fStack_58.super__Function_base);
  Channel::enableWriting
            ((this->_channel)._M_t.
             super___uniq_ptr_impl<mario::Channel,_std::default_delete<mario::Channel>_>._M_t.
             super__Tuple_impl<0UL,_mario::Channel_*,_std::default_delete<mario::Channel>_>.
             super__Head_base<0UL,_mario::Channel_*,_false>._M_head_impl);
  return;
}

Assistant:

void Connector::connecting(int sockfd) {
    setState(kConnecting);
    _channel.reset(new Channel(_loop, sockfd));
    _channel->setWriteCallback(
            std::bind(&Connector::handleWrite, this)
            );
    _channel->setErrorCallback(
            std::bind(&Connector::handleError, this)
            );
    _channel->enableWriting();
}